

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

boolean attacks(int adtyp,obj *otmp,obj *olaunch,boolean thrown)

{
  char cVar1;
  artifact *paVar2;
  
  if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
    paVar2 = (artifact *)0x0;
  }
  else {
    paVar2 = artilist + otmp->oartifact;
  }
  if (paVar2 != (artifact *)0x0) {
    return (uint)(paVar2->attk).adtyp == adtyp;
  }
  if (otmp->oprops == 0) {
    if ((otmp->oclass != '\r') && (otmp->oclass != '\x02')) {
      return '\0';
    }
    cVar1 = objects[otmp->otyp].oc_subtyp;
    if (cVar1 < -0x18) {
      return '\0';
    }
    if (olaunch == (obj *)0x0) {
      return '\0';
    }
    if (-0x16 < cVar1) {
      return '\0';
    }
    if ((int)cVar1 + (int)objects[olaunch->otyp].oc_subtyp != 0) {
      return '\0';
    }
    if (olaunch->oprops == 0) {
      return '\0';
    }
  }
  if (adtyp == 0xf) {
    cVar1 = oprop_attack(4,otmp,olaunch,thrown);
  }
  else if (adtyp == 3) {
    cVar1 = oprop_attack(2,otmp,olaunch,thrown);
  }
  else {
    if (adtyp != 2) {
      return '\0';
    }
    cVar1 = oprop_attack(1,otmp,olaunch,thrown);
  }
  if (cVar1 == '\0') {
    return '\0';
  }
  return '\x01';
}

Assistant:

static boolean attacks(int adtyp, struct obj *otmp, struct obj *olaunch,
		       boolean thrown)
{
	const struct artifact *weap;

	if ((weap = get_artifact(otmp)) != 0)
		return (boolean)(weap->attk.adtyp == adtyp);

	if (!weap && (otmp->oprops ||
		      (ammo_and_launcher(otmp, olaunch) &&
		       olaunch->oprops))) {
	    if (adtyp == AD_FIRE &&
		oprop_attack(ITEM_FIRE, otmp, olaunch, thrown))
		return TRUE;
	    if (adtyp == AD_COLD &&
		oprop_attack(ITEM_FROST, otmp, olaunch, thrown))
		return TRUE;
	    if (adtyp == AD_DRLI &&
		oprop_attack(ITEM_DRLI, otmp, olaunch, thrown))
		return TRUE;
	}

	return FALSE;
}